

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

ExceptionOr<kj::HttpInputStream::Request> * __thiscall
kj::_::ExceptionOr<kj::HttpInputStream::Request>::operator=
          (ExceptionOr<kj::HttpInputStream::Request> *this,
          ExceptionOr<kj::HttpInputStream::Request> *param_1)

{
  Maybe<kj::Exception>::operator=((Maybe<kj::Exception> *)this,(Maybe<kj::Exception> *)param_1);
  Maybe<kj::HttpInputStream::Request>::operator=(&this->value,&param_1->value);
  return this;
}

Assistant:

ExceptionOr& operator=(ExceptionOr&&) = default;